

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *
Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::zero(void)

{
  int iVar1;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RDI;
  IntegerConstantType IStack_48;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_38;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_18;
  
  if (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p == '\0') {
    iVar1 = __cxa_guard_acquire(&Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p);
    if (iVar1 != 0) {
      IntegerConstantType::IntegerConstantType(&IStack_48,0);
      MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&local_38);
      Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)&local_18,
                 (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&local_38);
      Monom(&zero::p,&IStack_48,&local_18);
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack
                (&local_38);
      IntegerConstantType::~IntegerConstantType(&IStack_48);
      __cxa_atexit(~Monom,&zero::p,&__dso_handle);
      __cxa_guard_release(&Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p);
    }
  }
  Monom(in_RDI,&zero::p);
  return in_RDI;
}

Assistant:

Monom<Number> Monom<Number>::zero() 
{ 
  static Monom p = Monom(Numeral(0), perfect(MonomFactors<Number>()));
  ASS(p.isZeroConst()) 
  return p; 
}